

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS
ref_cell_local_gem(REF_CELL ref_cell,REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_BOOL *local)

{
  uint uVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  *local = 0;
  if (((-1 < node0) && (pRVar2 = ref_cell->ref_adj, node0 < pRVar2->nnode)) &&
     (lVar4 = (long)pRVar2->first[(uint)node0], lVar4 != -1)) {
    pRVar3 = pRVar2->item + lVar4;
    uVar1 = ref_cell->node_per;
    while( true ) {
      if (0 < (int)uVar1) {
        lVar5 = (long)ref_cell->size_per * (long)pRVar3->ref;
        uVar6 = 0;
        do {
          if (ref_cell->c2n[lVar5 + uVar6] == node1) {
            uVar7 = 0;
            do {
              if (ref_node->ref_mpi->id != ref_node->part[ref_cell->c2n[lVar5 + uVar7]]) {
                return 0;
              }
              uVar7 = uVar7 + 1;
            } while (uVar1 != uVar7);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar1);
      }
      pRVar3 = ref_cell->ref_adj->item;
      lVar4 = (long)pRVar3[(int)lVar4].next;
      if (lVar4 == -1) break;
      pRVar3 = pRVar3 + lVar4;
    }
  }
  *local = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_local_gem(REF_CELL ref_cell, REF_NODE ref_node,
                                      REF_INT node0, REF_INT node1,
                                      REF_BOOL *local) {
  REF_INT item, cell, search_node, test_node;

  *local = REF_FALSE;

  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (search_node = 0; search_node < ref_cell_node_per(ref_cell);
         search_node++) {
      if (node1 == ref_cell_c2n(ref_cell, search_node, cell)) {
        for (test_node = 0; test_node < ref_cell_node_per(ref_cell);
             test_node++) {
          if (!ref_node_owned(ref_node,
                              ref_cell_c2n(ref_cell, test_node, cell))) {
            return REF_SUCCESS;
          }
        }
      }
    }
  }

  *local = REF_TRUE;

  return REF_SUCCESS;
}